

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * __thiscall BigNumber::operator=(BigNumber *this,BigNumber *nb)

{
  pointer puVar1;
  
  this->m_base = nb->m_base;
  puVar1 = (this->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_Polynome).m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->super_Polynome).m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb);
  return this;
}

Assistant:

BigNumber& BigNumber::operator = (BigNumber nb){
    this->m_base = nb.m_base;
    this->m_coef.clear();
    this->m_coef = nb.m_coef;
    return *this;
}